

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOptions.cpp
# Opt level: O0

void __thiscall nvtt::InputOptions::Private::computeTargetExtents(Private *this)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  uint local_3c;
  uint local_38 [3];
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint maxwhd;
  uint d;
  uint h;
  uint w;
  uint maxExtent;
  Private *this_local;
  
  _w = this;
  if ((this->images == (InputImage *)0x0) &&
     (iVar1 = nvAbort("images != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvtt/InputOptions.cpp"
                      ,0x142,"void nvtt::InputOptions::Private::computeTargetExtents() const"),
     iVar1 == 1)) {
    raise(5);
  }
  h = this->maxExtent;
  if (this->roundMode != RoundMode_None) {
    h = anon_unknown.dwarf_472314::previousPowerOfTwo(h);
  }
  d = this->images->width;
  maxwhd = this->images->height;
  local_20 = this->images->depth;
  puVar3 = nv::max<unsigned_int>(&d,&maxwhd);
  puVar3 = nv::max<unsigned_int>(puVar3,&local_20);
  local_24 = *puVar3;
  if ((h != 0) && (h < local_24)) {
    local_28 = (d * h) / local_24;
    local_2c = 1;
    puVar3 = nv::max<unsigned_int>(&local_28,&local_2c);
    d = *puVar3;
    local_38[2] = (maxwhd * h) / local_24;
    local_38[1] = 1;
    puVar3 = nv::max<unsigned_int>(local_38 + 2,local_38 + 1);
    maxwhd = *puVar3;
    local_38[0] = (local_20 * h) / local_24;
    local_3c = 1;
    puVar3 = nv::max<unsigned_int>(local_38,&local_3c);
    local_20 = *puVar3;
  }
  if (this->roundMode == RoundMode_ToNextPowerOfTwo) {
    d = nv::nextPowerOfTwo(d);
    maxwhd = nv::nextPowerOfTwo(maxwhd);
    local_20 = nv::nextPowerOfTwo(local_20);
  }
  else if (this->roundMode == RoundMode_ToNearestPowerOfTwo) {
    d = anon_unknown.dwarf_472314::nearestPowerOfTwo(d);
    maxwhd = anon_unknown.dwarf_472314::nearestPowerOfTwo(maxwhd);
    local_20 = anon_unknown.dwarf_472314::nearestPowerOfTwo(local_20);
  }
  else if (this->roundMode == RoundMode_ToPreviousPowerOfTwo) {
    d = anon_unknown.dwarf_472314::previousPowerOfTwo(d);
    maxwhd = anon_unknown.dwarf_472314::previousPowerOfTwo(maxwhd);
    local_20 = anon_unknown.dwarf_472314::previousPowerOfTwo(local_20);
  }
  this->targetWidth = d;
  this->targetHeight = maxwhd;
  this->targetDepth = local_20;
  uVar2 = anon_unknown.dwarf_472314::countMipmaps(d,maxwhd,local_20);
  this->targetMipmapCount = uVar2;
  return;
}

Assistant:

void InputOptions::Private::computeTargetExtents() const
{
	nvCheck(images != NULL);
	
	uint maxExtent = this->maxExtent;
	if (roundMode != RoundMode_None)
	{
		// rounded max extent should never be higher than original max extent.
		maxExtent = previousPowerOfTwo(maxExtent);
	}

	uint w = images->width;
	uint h = images->height;
	uint d = images->depth;
	
	nvDebugCheck(w > 0);
	nvDebugCheck(h > 0);
	nvDebugCheck(d > 0);
	
	// Scale extents without changing aspect ratio.
	uint maxwhd = max(max(w, h), d);
	if (maxExtent != 0 && maxwhd > maxExtent)
	{
		w = max((w * maxExtent) / maxwhd, 1U);
		h = max((h * maxExtent) / maxwhd, 1U);
		d = max((d * maxExtent) / maxwhd, 1U);
	}
	
	// Round to power of two.
	if (roundMode == RoundMode_ToNextPowerOfTwo)
	{
		w = nextPowerOfTwo(w);
		h = nextPowerOfTwo(h);
		d = nextPowerOfTwo(d);
	}
	else if (roundMode == RoundMode_ToNearestPowerOfTwo)
	{
		w = nearestPowerOfTwo(w);
		h = nearestPowerOfTwo(h);
		d = nearestPowerOfTwo(d);
	}
	else if (roundMode == RoundMode_ToPreviousPowerOfTwo)
	{
		w = previousPowerOfTwo(w);
		h = previousPowerOfTwo(h);
		d = previousPowerOfTwo(d);
	}
	
	this->targetWidth = w;
	this->targetHeight = h;
	this->targetDepth = d;
	
	this->targetMipmapCount = countMipmaps(w, h, d);
}